

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# planner.cpp
# Opt level: O2

bool __thiscall despot::Planner::RunStep(Planner *this,Solver *solver,World *world,Logger *logger)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  log_ostream *plVar5;
  ostream *poVar6;
  double dVar7;
  double dVar8;
  OBS_TYPE obs;
  undefined8 local_40;
  double local_38;
  
  Logger::CheckTargetTime(logger);
  local_38 = get_time_second();
  dVar7 = get_time_second();
  uVar2 = (*solver->_vptr_Solver[2])(solver);
  dVar8 = get_time_second();
  iVar3 = logging::level();
  if (0 < iVar3) {
    iVar3 = logging::level();
    if (2 < iVar3) {
      plVar5 = logging::stream(3);
      poVar6 = std::operator<<(&plVar5->super_ostream,"[RunStep] Time spent in ");
      poVar6 = std::operator<<(poVar6,*(char **)(solver->_vptr_Solver[-1] + 8) +
                                      (**(char **)(solver->_vptr_Solver[-1] + 8) == '*'));
      std::operator<<(poVar6,"::Search(): ");
      poVar6 = std::ostream::_M_insert<double>(dVar8 - dVar7);
      std::endl<char,std::char_traits<char>>(poVar6);
    }
  }
  dVar7 = get_time_second();
  uVar4 = (*world->_vptr_World[6])(world,(ulong)uVar2,&local_40);
  dVar8 = get_time_second();
  iVar3 = logging::level();
  if (0 < iVar3) {
    iVar3 = logging::level();
    if (2 < iVar3) {
      plVar5 = logging::stream(3);
      std::operator<<(&plVar5->super_ostream,"[RunStep] Time spent in ExecuteAction(): ");
      poVar6 = std::ostream::_M_insert<double>(dVar8 - dVar7);
      std::endl<char,std::char_traits<char>>(poVar6);
    }
  }
  dVar7 = get_time_second();
  (*solver->_vptr_Solver[3])(solver,(ulong)uVar2,local_40);
  dVar8 = get_time_second();
  iVar3 = logging::level();
  if (0 < iVar3) {
    iVar3 = logging::level();
    if (2 < iVar3) {
      plVar5 = logging::stream(3);
      std::operator<<(&plVar5->super_ostream,"[RunStep] Time spent in Update(): ");
      poVar6 = std::ostream::_M_insert<double>(dVar8 - dVar7);
      std::endl<char,std::char_traits<char>>(poVar6);
    }
  }
  uVar1 = this->step_;
  this->step_ = uVar1 + 1;
  iVar3 = (*logger->_vptr_Logger[4])
                    (local_38,logger,(ulong)uVar1,(ulong)(uint)this->round_,(ulong)(uVar4 & 0xff),
                     (ulong)uVar2,local_40);
  return SUB41(iVar3,0);
}

Assistant:

bool Planner::RunStep(Solver* solver, World* world, Logger* logger) {

	logger->CheckTargetTime();

	double step_start_t = get_time_second();

	double start_t = get_time_second();
	ACT_TYPE action = solver->Search().action;
	double end_t = get_time_second();
	double search_time = (end_t - start_t);
	logi << "[RunStep] Time spent in " << typeid(*solver).name()
			<< "::Search(): " << search_time << endl;

	OBS_TYPE obs;
	start_t = get_time_second();
	bool terminal = world->ExecuteAction(action, obs);
	end_t = get_time_second();
	double execute_time = (end_t - start_t);
	logi << "[RunStep] Time spent in ExecuteAction(): " << execute_time << endl;

	start_t = get_time_second();
	solver->BeliefUpdate(action, obs);
	end_t = get_time_second();
	double update_time = (end_t - start_t);
	logi << "[RunStep] Time spent in Update(): " << update_time << endl;

	return logger->SummarizeStep(step_++, round_, terminal, action, obs,
			step_start_t);
}